

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed-fstream.h
# Opt level: O0

void __thiscall
cnn::compressed_ifstream::compressed_ifstream(compressed_ifstream *this,string *fname)

{
  undefined1 uVar1;
  char *pcVar2;
  ulong in_RSI;
  undefined8 *in_RDI;
  string suf;
  size_t pos;
  char *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined8 *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  basic_istream<char,_std::char_traits<char>_> *is;
  chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  streamsize in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  basic_gzip_decompressor<std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_48 [32];
  long local_28;
  ulong local_10;
  
  local_10 = in_RSI;
  std::ios::ios((ios *)(in_RDI + 0x4f));
  *in_RDI = 0x762160;
  in_RDI[0x4f] = 0x762188;
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__007621a0);
  *in_RDI = 0x762160;
  in_RDI[0x4f] = 0x762188;
  this_00 = (chain_client<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(this_00,pcVar2,_S_in);
  is = (basic_istream<char,_std::char_traits<char>_> *)(in_RDI + 0x43);
  boost::iostreams::
  filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  ::filtering_streambuf
            ((filtering_streambuf<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
              *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  local_28 = std::__cxx11::string::rfind((char)local_10,0x2e);
  if ((local_28 != -1) && (local_28 != 0)) {
    std::__cxx11::string::substr((ulong)local_48,local_10);
    in_stack_fffffffffffffee7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
    if ((bool)in_stack_fffffffffffffee7) {
      in_stack_fffffffffffffed8 = in_RDI + 0x4b;
      boost::iostreams::basic_gzip_decompressor<std::allocator<char>_>::basic_gzip_decompressor
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
      boost::iostreams::detail::
      chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
      ::push<boost::iostreams::basic_gzip_decompressor<std::allocator<char>>>
                (this_00,(basic_gzip_decompressor<std::allocator<char>_> *)is,
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (streamsize)in_stack_fffffffffffffed8,
                 (type *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      boost::iostreams::basic_gzip_decompressor<std::allocator<char>_>::~basic_gzip_decompressor
                ((basic_gzip_decompressor<std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    }
    else {
      uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                              in_stack_fffffffffffffec8);
      if ((bool)uVar1) {
        boost::iostreams::basic_bzip2_decompressor<std::allocator<char>_>::basic_bzip2_decompressor
                  ((basic_bzip2_decompressor<std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffed0),SUB81((ulong)(in_RDI + 0x4b) >> 0x38,0)
                   ,0x47deb8);
        boost::iostreams::detail::
        chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
        ::push<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
                  (this_00,(basic_bzip2_decompressor<std::allocator<char>_> *)is,
                   CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   (streamsize)in_stack_fffffffffffffed8,
                   (type *)CONCAT17(uVar1,in_stack_fffffffffffffed0));
        boost::iostreams::basic_bzip2_decompressor<std::allocator<char>_>::~basic_bzip2_decompressor
                  ((basic_bzip2_decompressor<std::allocator<char>_> *)0x47dee3);
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  boost::iostreams::detail::
  chain_client<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
  ::push<char,std::char_traits<char>>
            (this_00,is,CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (streamsize)in_stack_fffffffffffffed8);
  return;
}

Assistant:

compressed_ifstream(const std::string& fname) : std::istream(&inbuf), file(fname.c_str()) {
    std::size_t pos = fname.rfind('.');
    if (pos != std::string::npos && pos > 0) {
      const std::string suf = fname.substr(pos + 1);
      if (suf == "gz") {
        inbuf.push(boost::iostreams::gzip_decompressor());
      }
      else if (suf == "bz2")
        inbuf.push(boost::iostreams::bzip2_decompressor());
    }
    inbuf.push(file);
  }